

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O0

int Au_NtkAllocObj(Au_Ntk_t *p,int nFanins,int Type)

{
  int iVar1;
  int iVar2;
  Au_Obj_t *p_00;
  Au_Obj_t *pAVar3;
  ulong uVar4;
  int nObjIntReal;
  int Id;
  int nObjInt;
  Au_Obj_t *pTemp;
  Au_Obj_t *pObj;
  Au_Obj_t *pMem;
  int Type_local;
  int nFanins_local;
  Au_Ntk_t *p_local;
  
  iVar1 = (nFanins + 2 >> 2) + (uint)((nFanins + 2U & 3) != 0);
  nObjIntReal = iVar1;
  if (0x3f < iVar1) {
    nObjIntReal = ((iVar1 + -0x3f >> 6) + (uint)((iVar1 - 0x3fU & 0x3f) != 0)) * 0x40 + 0x3f;
  }
  iVar2 = Vec_PtrSize(&p->vPages);
  if ((iVar2 == 0) || (0x1000 < p->iHandle + nObjIntReal)) {
    if (nObjIntReal + 0x40 < 0x1001) {
      pObj = (Au_Obj_t *)calloc(0x1040,0x10);
      p->nObjsAlloc = p->nObjsAlloc + 0x1040;
    }
    else {
      pObj = (Au_Obj_t *)calloc((long)(nObjIntReal + 0x40),0x10);
      p->nObjsAlloc = nObjIntReal + 0x40 + p->nObjsAlloc;
    }
    Vec_PtrPush(p->vChunks,pObj);
    if (((ulong)pObj & 0xf) != 0) {
      pObj = (Au_Obj_t *)((long)pObj + (0x10 - ((ulong)pObj & 0xf)));
    }
    if (((ulong)pObj & 0xf) != 0) {
      __assert_fail("((ABC_PTRINT_T)pMem & 0xF) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieNew.c"
                    ,0x309,"int Au_NtkAllocObj(Au_Ntk_t *, int, int)");
    }
    p->iHandle = (int)((long)((ulong)pObj & 0x3ff) >> 4);
    if (p->iHandle != 0) {
      pObj = pObj + (int)(0x40 - (p->iHandle & 0x3fU));
      p->iHandle = 0;
    }
    Vec_PtrPush(&p->vPages,pObj);
    Au_NtkInsertHeader(p);
  }
  else {
    pObj = (Au_Obj_t *)Vec_PtrEntryLast(&p->vPages);
    if (((p->iHandle & 0x3fU) == 0) || ((int)(0x40 - (p->iHandle & 0x3fU)) < nObjIntReal)) {
      if ((p->iHandle & 0x3fU) != 0) {
        p->iHandle = (0x40 - (p->iHandle & 0x3fU)) + p->iHandle;
      }
      Au_NtkInsertHeader(p);
    }
    if (0x1000 < p->iHandle + nObjIntReal) {
      iVar1 = Au_NtkAllocObj(p,nFanins,Type);
      return iVar1;
    }
  }
  p_00 = pObj + p->iHandle;
  if (*(int *)p_00 != 0) {
    __assert_fail("*((int *)pObj) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieNew.c"
                  ,800,"int Au_NtkAllocObj(Au_Ntk_t *, int, int)");
  }
  *(ulong *)p_00 = *(ulong *)p_00 & 0x7ffffffff | (ulong)(uint)nFanins << 0x23;
  uVar4 = (ulong)(uint)Type & 7;
  *(ulong *)p_00 = *(ulong *)p_00 & 0xfffffff8ffffffff | uVar4 << 0x20;
  p->nObjs[uVar4] = p->nObjs[uVar4] + 1;
  if (Type == 2) {
    iVar2 = Vec_IntSize(&p->vPis);
    Au_ObjSetFaninLit(p_00,0,iVar2);
    iVar2 = Au_ObjId(p_00);
    Vec_IntPush(&p->vPis,iVar2);
  }
  else if (Type == 3) {
    iVar2 = Vec_IntSize(&p->vPos);
    Au_ObjSetFaninLit(p_00,1,iVar2);
    iVar2 = Au_ObjId(p_00);
    Vec_IntPush(&p->vPos,iVar2);
  }
  p->iHandle = nObjIntReal + p->iHandle;
  p->nObjsUsed = iVar1 + p->nObjsUsed;
  iVar1 = Au_ObjId(p_00);
  Vec_IntPush(&p->vObjs,iVar1);
  pAVar3 = Au_NtkObj(p,iVar1);
  if (pAVar3 == p_00) {
    return iVar1;
  }
  __assert_fail("pTemp == pObj",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieNew.c"
                ,0x333,"int Au_NtkAllocObj(Au_Ntk_t *, int, int)");
}

Assistant:

int Au_NtkAllocObj( Au_Ntk_t * p, int nFanins, int Type )
{
    Au_Obj_t * pMem, * pObj, * pTemp;
    int nObjInt = ((2+nFanins) >> 2) + (((2+nFanins) & 3) > 0);
    int Id, nObjIntReal = nObjInt;
    if ( nObjInt > 63 )
        nObjInt = 63 + 64 * (((nObjInt-63) >> 6) + (((nObjInt-63) & 63) > 0));
    if ( Vec_PtrSize(&p->vPages) == 0 || p->iHandle + nObjInt > (1 << 12) )
    {
        if ( nObjInt + 64 > (1 << 12) )
            pMem = ABC_CALLOC( Au_Obj_t, nObjInt + 64 ), p->nObjsAlloc += nObjInt + 64;
        else
            pMem = ABC_CALLOC( Au_Obj_t, (1 << 12) + 64 ), p->nObjsAlloc += (1 << 12) + 64;
        Vec_PtrPush( p->vChunks, pMem );
        if ( ((ABC_PTRINT_T)pMem & 0xF) )
            pMem = (Au_Obj_t *)((char *)pMem + 16 - ((ABC_PTRINT_T)pMem & 0xF));
        assert( ((ABC_PTRINT_T)pMem & 0xF) == 0 );
        p->iHandle = (((ABC_PTRINT_T)pMem & 0x3FF) >> 4);
        if ( p->iHandle )
        {
            pMem += 64 - (p->iHandle & 63);
            p->iHandle = 0; 
        }
        Vec_PtrPush( &p->vPages, pMem );
        Au_NtkInsertHeader( p );
    }
    else
    {
        pMem = (Au_Obj_t *)Vec_PtrEntryLast( &p->vPages );
        if ( (p->iHandle & 63) == 0 || nObjInt > (64 - (p->iHandle & 63)) )
        {
            if ( p->iHandle & 63 )
                p->iHandle += 64 - (p->iHandle & 63); 
            Au_NtkInsertHeader( p );
        }
        if ( p->iHandle + nObjInt > (1 << 12) )
            return Au_NtkAllocObj( p, nFanins, Type );
    }
    pObj = pMem + p->iHandle;
    assert( *((int *)pObj) == 0 );
    pObj->nFanins = nFanins;
    p->nObjs[pObj->Type = Type]++;
    if ( Type == AU_OBJ_PI )
    {
        Au_ObjSetFaninLit( pObj, 0, Vec_IntSize(&p->vPis) );
        Vec_IntPush( &p->vPis, Au_ObjId(pObj) );
    }
    else if ( Type == AU_OBJ_PO )
    {
        Au_ObjSetFaninLit( pObj, 1, Vec_IntSize(&p->vPos) );
        Vec_IntPush( &p->vPos, Au_ObjId(pObj) );
    }
    p->iHandle += nObjInt;
    p->nObjsUsed += nObjIntReal;

    Id = Au_ObjId(pObj);
    Vec_IntPush( &p->vObjs, Id );
    pTemp = Au_NtkObj( p, Id );
    assert( pTemp == pObj );
    return Id;
}